

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

SUNErrCode SUNMatCopy_Dense(SUNMatrix A,SUNMatrix B)

{
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  SUNMatrix B_local;
  SUNMatrix A_local;
  
  for (j = 0; j < *(long *)((long)A->content + 8); j = j + 1) {
    for (i = 0; i < *A->content; i = i + 1) {
      *(undefined8 *)(*(long *)(*(long *)((long)B->content + 0x20) + j * 8) + i * 8) =
           *(undefined8 *)(*(long *)(*(long *)((long)A->content + 0x20) + j * 8) + i * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatCopy_Dense(SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation B_ij = A_ij */
  for (j = 0; j < SM_COLUMNS_D(A); j++)
  {
    for (i = 0; i < SM_ROWS_D(A); i++)
    {
      SM_ELEMENT_D(B, i, j) = SM_ELEMENT_D(A, i, j);
    }
  }

  return SUN_SUCCESS;
}